

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_reader_mocks.cpp
# Opt level: O2

refiller_function * yield_string(refiller_function *__return_storage_ptr__,string *str)

{
  string *this;
  string asStack_38 [32];
  
  std::__cxx11::string::string(asStack_38,(string *)str);
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  this = (string *)operator_new(0x20);
  std::__cxx11::string::string(this,asStack_38);
  *(string **)&(__return_storage_ptr__->super__Function_base)._M_functor = this;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/buffered_reader_mocks.cpp:58:12)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/buffered_reader_mocks.cpp:58:12)>
       ::_M_manager;
  std::__cxx11::string::~string(asStack_38);
  return __return_storage_ptr__;
}

Assistant:

refiller_function yield_string (std::string const & str) {
    return [str] (int io, pstore::gsl::span<std::uint8_t> const & s) {
        PSTORE_ASSERT (str.length () <= pstore::unsigned_cast (s.size ()));
        return refiller_result_type{
            pstore::in_place, io + 1,
            std::transform (str.begin (), str.end (), s.begin (), [] (std::uint8_t v) {
                PSTORE_ASSERT (v < 128);
                return static_cast<char> (v);
            })};
    };
}